

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::internal_node<int,_false>_> __thiscall
immutable::rrb_details::rebalance<int,false,6>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<int,_false>_> *left,
          ref<immutable::rrb_details::internal_node<int,_false>_> *centre,
          ref<immutable::rrb_details::internal_node<int,_false>_> *right,uint32_t shift,bool is_top)

{
  long lVar1;
  ref<immutable::rrb_details::internal_node<int,_false>_> rVar2;
  ref<immutable::rrb_details::internal_node<int,_false>_> rVar3;
  internal_node<int,_false> *piVar4;
  undefined8 *puVar5;
  long lVar6;
  uint uVar7;
  ulong uVar9;
  ref<immutable::rrb_details::internal_node<int,_false>_> new_left;
  uint32_t top_len;
  ref<immutable::rrb_details::internal_node<int,_false>_> new_all;
  ref<immutable::rrb_details::internal_node<int,_false>_> all;
  ref<immutable::rrb_details::internal_node<int,_false>_> new_right;
  vector<unsigned_int,_std::allocator<unsigned_int>_> node_count;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_88;
  undefined1 local_7c [4];
  ref<immutable::rrb_details::internal_node<int,_false>_> local_78;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_70;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_68;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_60;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_58;
  internal_node<int,_false> *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  ulong uVar8;
  
  local_70.ptr = internal_node_merge<int,false>(left,centre,right);
  if (local_70.ptr != (internal_node<int,_false> *)0x0) {
    (local_70.ptr)->_ref_count = 1;
  }
  create_concat_plan<int,false,6>
            (&local_48,(rrb_details *)&local_70,
             (ref<immutable::rrb_details::internal_node<int,_false>_> *)local_7c,(uint32_t *)right);
  execute_concat_plan<int,false,6>
            ((rrb_details *)&local_78,&local_70,&local_48,(uint32_t)local_7c,shift);
  rVar2.ptr = local_78.ptr;
  if ((uint)local_7c < 0x41) {
    if (is_top) {
      *(internal_node<int,_false> **)this = local_78.ptr;
      if (local_78.ptr != (internal_node<int,_false> *)0x0) {
        (local_78.ptr)->_ref_count = (local_78.ptr)->_ref_count + 1;
      }
    }
    else {
      set_sizes<int,false,6>((rrb_details *)&local_88,&local_78,shift);
      puVar5 = (undefined8 *)malloc(0x28);
      *puVar5 = 0x100000001;
      puVar5[2] = 0;
      *(undefined4 *)((long)puVar5 + 0xc) = 0;
      puVar5[3] = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(puVar5 + 4);
      puVar5[4] = 0;
      ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                ((ref<immutable::rrb_details::internal_node<int,_false>_> *)(puVar5 + 4),&local_88);
      *(undefined8 **)this = puVar5;
      *(undefined4 *)(puVar5 + 1) = 1;
      release<int>(local_88.ptr);
    }
  }
  else {
    piVar4 = (internal_node<int,_false> *)malloc(0x220);
    piVar4->type = INTERNAL_NODE;
    piVar4->len = 0x40;
    (piVar4->size_table).ptr = (rrb_size_table<false> *)0x0;
    piVar4->guid = 0;
    piVar4->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar4 + 1);
    lVar6 = 0;
    memset(piVar4 + 1,0,0x200);
    do {
      ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                 ((long)&piVar4->child->ptr + lVar6),
                 (ref<immutable::rrb_details::internal_node<int,_false>_> *)
                 ((long)&(rVar2.ptr)->child->ptr + lVar6));
      rVar3.ptr = local_78.ptr;
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x200);
    piVar4->_ref_count = 1;
    uVar7 = (int)local_7c - 0x40;
    uVar8 = (ulong)uVar7;
    local_88.ptr = piVar4;
    local_50 = (internal_node<int,_false> *)this;
    piVar4 = (internal_node<int,_false> *)malloc(uVar8 * 8 + 0x20);
    piVar4->len = uVar7;
    piVar4->type = INTERNAL_NODE;
    (piVar4->size_table).ptr = (rrb_size_table<false> *)0x0;
    piVar4->guid = 0;
    piVar4->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar4 + 1);
    memset(piVar4 + 1,0,uVar8 * 8);
    if (uVar7 != 0) {
      uVar9 = 0x40;
      lVar6 = 0;
      do {
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   ((long)&piVar4->child->ptr + lVar6),(rVar3.ptr)->child + (uVar9 & 0xffffffff));
        lVar1 = uVar9 - uVar8;
        uVar9 = uVar9 + 1;
        lVar6 = lVar6 + 8;
      } while (lVar1 != 0x3f);
    }
    piVar4->_ref_count = 1;
    local_58.ptr = piVar4;
    set_sizes<int,false,6>((rrb_details *)&local_60,&local_88,shift);
    this = (rrb_details *)local_50;
    set_sizes<int,false,6>((rrb_details *)&local_68,&local_58,shift);
    puVar5 = (undefined8 *)malloc(0x30);
    *puVar5 = 0x200000001;
    puVar5[2] = 0;
    *(undefined4 *)((long)puVar5 + 0xc) = 0;
    puVar5[3] = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(puVar5 + 4);
    puVar5[4] = 0;
    puVar5[5] = 0;
    ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
              ((ref<immutable::rrb_details::internal_node<int,_false>_> *)(puVar5 + 4),&local_60);
    ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
              ((ref<immutable::rrb_details::internal_node<int,_false>_> *)(puVar5[3] + 8),&local_68)
    ;
    *(undefined8 **)this = puVar5;
    *(undefined4 *)(puVar5 + 1) = 1;
    release<int>(local_68.ptr);
    release<int>(local_60.ptr);
    release<int>(local_58.ptr);
    release<int>(local_88.ptr);
  }
  release<int>(local_78.ptr);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  release<int>(local_70.ptr);
  return (ref<immutable::rrb_details::internal_node<int,_false>_>)(internal_node<int,_false> *)this;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> rebalance(const ref<internal_node<T, atomic_ref_counting>>& left, const ref<internal_node<T, atomic_ref_counting>>& centre, const ref<internal_node<T, atomic_ref_counting>>& right, uint32_t shift, bool is_top)
      {
      ref<internal_node<T, atomic_ref_counting>> all = internal_node_merge(left, centre, right);
      // top_len is children count of the internal node returned.
      uint32_t top_len; // populated through pointer manipulation.

      std::vector<uint32_t> node_count = create_concat_plan<T, atomic_ref_counting, N>(all, &top_len);

      ref<internal_node<T, atomic_ref_counting>> new_all = execute_concat_plan<T, atomic_ref_counting, N>(all, node_count, top_len, shift);
      if (top_len <= bits<N>::rrb_branching)
        {
        if (is_top == false)
          {
          return internal_node_new_above1(set_sizes<T, atomic_ref_counting, N>(new_all, shift));
          }
        else
          {
          return new_all;
          }
        }
      else
        {
        ref<internal_node<T, atomic_ref_counting>> new_left = internal_node_copy(new_all.ptr, 0, bits<N>::rrb_branching);
        ref<internal_node<T, atomic_ref_counting>> new_right = internal_node_copy(new_all.ptr, bits<N>::rrb_branching, top_len - bits<N>::rrb_branching);
        return internal_node_new_above<T, atomic_ref_counting>(set_sizes<T, atomic_ref_counting, N>(new_left, shift), set_sizes<T, atomic_ref_counting, N>(new_right, shift));
        }
      }